

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle1.cpp
# Opt level: O3

void __thiscall OpenMD::ContactAngle1::doFrame(ContactAngle1 *this,int param_1)

{
  SelectionManager *this_00;
  undefined8 *puVar1;
  iterator iVar2;
  uint i_1;
  StuntDouble *pSVar3;
  mapped_type *pmVar4;
  pointer pdVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  vector<double,_std::allocator<double>_> realRoots;
  int i;
  Polynomial<double> poly;
  double local_98;
  vector<double,_std::allocator<double>_> local_88;
  int local_6c;
  undefined1 local_68 [8];
  pointer pOStack_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  size_t local_40;
  double local_38 [4];
  
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ == true) {
    SelectionEvaluator::evaluate
              ((SelectionSet *)local_68,&(this->super_SequentialAnalyzer).evaluator1_);
    lVar6 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->super_SequentialAnalyzer).seleMan1_.ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar6),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_68)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar6));
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_68);
  }
  local_38[2] = (double)OpenMD::V3Zero._16_8_;
  local_38[0] = (double)OpenMD::V3Zero._0_8_;
  local_38[1] = (double)OpenMD::V3Zero._8_8_;
  this_00 = &(this->super_SequentialAnalyzer).seleMan1_;
  pSVar3 = SelectionManager::beginSelected(this_00,&local_6c);
  if (pSVar3 == (StuntDouble *)0x0) {
    local_98 = 0.0;
  }
  else {
    local_98 = 0.0;
    do {
      dVar8 = pSVar3->mass_;
      lVar6 = *(long *)((long)&(pSVar3->snapshotMan_->currentSnapshot_->atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar3->storage_);
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)(lVar6 + 0x10 + (long)pSVar3->localIndex_ * 0x18);
      puVar1 = (undefined8 *)(lVar6 + (long)pSVar3->localIndex_ * 0x18);
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*puVar1;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)puVar1[1];
      local_68 = (undefined1  [8])0x0;
      pOStack_60 = (pointer)0x0;
      local_58 = (_Base_ptr)0x0;
      lVar6 = 0;
      do {
        *(double *)(local_68 + lVar6 * 8) =
             (double)(&local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start)[lVar6] * dVar8;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar6 = 0;
      do {
        local_38[lVar6] = *(double *)(local_68 + lVar6 * 8) + local_38[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      local_98 = local_98 + dVar8;
      pSVar3 = SelectionManager::nextSelected(this_00,&local_6c);
    } while (pSVar3 != (StuntDouble *)0x0);
  }
  lVar6 = 0;
  do {
    local_38[lVar6] = local_38[lVar6] / local_98;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  dVar8 = local_38[2] - this->solidZ_;
  if (dVar8 < 0.0) {
    snprintf(painCave.errMsg,2000,
             "ContactAngle1: Z-center of mass of selection, %lf, was\n\tlocated below the solid reference plane, %lf\n"
            );
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  dVar7 = this->dropletRadius_;
  if (dVar8 <= dVar7) {
    local_50 = (_Base_ptr)&pOStack_60;
    pOStack_60 = (pointer)((ulong)pOStack_60 & 0xffffffff00000000);
    local_58 = (_Base_ptr)0x0;
    local_40 = 0;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 4;
    local_48 = local_50;
    pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)local_68,(key_type *)&local_88);
    dVar7 = dVar7 * 0.3968502629920499;
    dVar8 = dVar8 * dVar8 * dVar8;
    dVar7 = dVar7 * dVar7 * dVar7;
    *pmVar4 = dVar8 + dVar7;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 3;
    pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)local_68,(key_type *)&local_88);
    *pmVar4 = dVar8 * 8.0 + dVar7 * 8.0;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 2;
    pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)local_68,(key_type *)&local_88);
    *pmVar4 = dVar8 * 24.0 + dVar7 * 18.0;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 1;
    pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)local_68,(key_type *)&local_88);
    *pmVar4 = dVar8 * 32.0;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start._4_4_ << 0x20);
    pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)local_68,(key_type *)&local_88);
    *pmVar4 = dVar8 * 16.0 + dVar7 * -27.0;
    Polynomial<double>::FindRealRoots(&local_88,(Polynomial<double> *)local_68);
    if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start ==
        local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      dVar8 = -1.0;
    }
    else {
      pdVar5 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar7 = -1.0;
      do {
        dVar9 = 1.0;
        if (*pdVar5 <= 1.0) {
          dVar9 = *pdVar5;
        }
        dVar8 = -1.0;
        if (-1.0 <= dVar9) {
          dVar8 = dVar9;
        }
        if (dVar8 <= dVar7) {
          dVar8 = dVar7;
        }
        pdVar5 = pdVar5 + 1;
        dVar7 = dVar8;
      } while (pdVar5 != local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    local_38[3] = acos(dVar8);
    local_38[3] = local_38[3] * 57.29577951308232;
    iVar2._M_current =
         (this->super_SequentialAnalyzer).values_.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (this->super_SequentialAnalyzer).values_.super__Vector_base<double,_std::allocator<double>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&(this->super_SequentialAnalyzer).values_,iVar2,local_38 + 3);
    }
    else {
      *iVar2._M_current = local_38[3];
      (this->super_SequentialAnalyzer).values_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 *)local_68);
  }
  else {
    local_68 = (undefined1  [8])0x4066800000000000;
    iVar2._M_current =
         (this->super_SequentialAnalyzer).values_.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (this->super_SequentialAnalyzer).values_.super__Vector_base<double,_std::allocator<double>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&(this->super_SequentialAnalyzer).values_,iVar2,(double *)local_68);
    }
    else {
      *iVar2._M_current = 180.0;
      (this->super_SequentialAnalyzer).values_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  return;
}

Assistant:

void ContactAngle1::doFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    RealType mtot = 0.0;
    Vector3d com(V3Zero);
    RealType mass;

    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      mass = sd->getMass();
      mtot += mass;
      com += sd->getPos() * mass;
    }

    com /= mtot;

    RealType dz = com.z() - solidZ_;

    if (dz < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ContactAngle1: Z-center of mass of selection, %lf, was\n"
               "\tlocated below the solid reference plane, %lf\n",
               com.z(), solidZ_);
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (dz > dropletRadius_) {
      values_.push_back(180.0);
    } else {
      RealType k = pow(2.0, -4.0 / 3.0) * dropletRadius_;

      RealType z2 = dz * dz;
      RealType z3 = z2 * dz;
      RealType k2 = k * k;
      RealType k3 = k2 * k;

      Polynomial<RealType> poly;
      poly.setCoefficient(4, z3 + k3);
      poly.setCoefficient(3, 8.0 * z3 + 8.0 * k3);
      poly.setCoefficient(2, 24.0 * z3 + 18.0 * k3);
      poly.setCoefficient(1, 32.0 * z3);
      poly.setCoefficient(0, 16.0 * z3 - 27.0 * k3);
      vector<RealType> realRoots = poly.FindRealRoots();

      RealType ct;

      vector<RealType>::iterator ri;

      RealType maxct = -1.0;
      for (ri = realRoots.begin(); ri != realRoots.end(); ++ri) {
        ct = *ri;
        if (ct > 1.0) ct = 1.0;
        if (ct < -1.0) ct = -1.0;

        // use the largest magnitude of ct that it finds:
        if (ct > maxct) { maxct = ct; }
      }

      values_.push_back(acos(maxct) * (180.0 / Constants::PI));
    }
  }